

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

bool __thiscall SAT::propagate(SAT *this)

{
  Reason r;
  Reason r_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Lit *pLVar5;
  anon_union_8_2_743a5d44_for_WatchElem_0 *paVar6;
  Propagator **ppPVar7;
  Lit *pLVar8;
  long in_RDI;
  uint k;
  Lit false_lit;
  Clause *c;
  Lit q;
  WatchElem *we;
  WatchElem *end;
  WatchElem *j;
  WatchElem *i;
  vec<WatchElem> *ws;
  Lit p;
  vec<Lit> *trail;
  int *qhead;
  int num_props;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  vec<WatchElem> *in_stack_fffffffffffffea0;
  SAT *in_stack_fffffffffffffea8;
  vec<WatchElem> *in_stack_fffffffffffffeb0;
  bool local_131;
  SAT *in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed8;
  Reason local_100;
  int local_f8;
  int8_t local_f1;
  int local_f0;
  lbool local_e9;
  anon_union_8_2_743a5d44_for_WatchElem_0 local_e8;
  WatchElem local_e0;
  int local_d4;
  int local_d0;
  int8_t local_c9;
  int local_c8;
  lbool local_c1;
  uint local_c0;
  int local_bc;
  int local_b8;
  Lit local_b4;
  anon_union_8_2_743a5d44_for_WatchElem_0 local_b0;
  int8_t local_a1;
  int local_a0;
  lbool local_9a;
  int8_t local_99;
  int local_98;
  lbool local_91;
  Clause *local_90;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_68;
  int local_64;
  int8_t local_5d;
  int local_5c;
  anon_union_8_2_743a5d44_for_WatchElem_0 *local_58;
  anon_union_8_2_743a5d44_for_WatchElem_0 *local_50;
  anon_union_8_2_743a5d44_for_WatchElem_0 *local_48;
  anon_union_8_2_743a5d44_for_WatchElem_0 *local_40;
  int local_34;
  vec<WatchElem> *local_30;
  int local_24;
  vec<Lit> *local_20;
  uint *local_18;
  int local_c;
  
  local_c = 0;
  local_18 = (uint *)vec<int>::last((vec<int> *)(in_RDI + 0xd0));
  local_20 = vec<vec<Lit>_>::last((vec<vec<Lit>_> *)(in_RDI + 0xc0));
  do {
    do {
      uVar3 = *local_18;
      uVar2 = vec<Lit>::size(local_20);
      if ((int)uVar2 <= (int)uVar3) {
        *(long *)(in_RDI + 0x200) = (long)local_c + *(long *)(in_RDI + 0x200);
        return *(long *)(in_RDI + 0xf0) == 0;
      }
      local_c = local_c + 1;
      uVar3 = *local_18;
      *local_18 = uVar3 + 1;
      pLVar5 = vec<Lit>::operator[](local_20,uVar3);
      local_34 = pLVar5->x;
      local_24 = local_34;
      uVar3 = toInt((Lit)local_34);
      local_30 = vec<vec<WatchElem>_>::operator[]((vec<vec<WatchElem>_> *)(in_RDI + 0x40),uVar3);
      uVar3 = vec<WatchElem>::size(local_30);
    } while (uVar3 == 0);
    paVar6 = &::vec::operator_cast_to_WatchElem_((vec *)local_30)->field_0;
    local_48 = paVar6;
    local_40 = paVar6;
    uVar3 = vec<WatchElem>::size(local_30);
    local_50 = &((WatchElem *)paVar6)[uVar3].field_0;
LAB_00292f6a:
    if (local_40 != local_50) {
      local_58 = local_40;
      uVar3 = WatchElem::type((WatchElem *)local_40);
      if (uVar3 == 1) {
        *local_48 = *local_40;
        local_48 = local_48 + 1;
        local_40 = local_40 + 1;
        WatchElem::d2((WatchElem *)local_58);
        local_64 = (int)toLit(0x293004);
        local_5c = local_64;
        local_5d = (int8_t)value(in_stack_fffffffffffffea8,(Lit)(int)in_stack_fffffffffffffeb0);
        in_stack_fffffffffffffed8 = toInt((lbool)0x0);
        if (in_stack_fffffffffffffed8 == -1) {
          local_7c = local_5c;
          local_84 = local_24;
          local_80 = (int)operator~((Lit)0x2930e2);
          setConfl((SAT *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                   (Lit)(int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (Lit)(int)in_stack_fffffffffffffea0);
          uVar3 = vec<Lit>::size(local_20);
          *local_18 = uVar3;
          while (local_40 < local_50) {
            *local_48 = *local_40;
            local_48 = local_48 + 1;
            local_40 = local_40 + 1;
          }
        }
        else if (in_stack_fffffffffffffed8 == 0) {
          local_68 = local_5c;
          local_78 = local_24;
          local_74 = (int)operator~((Lit)0x293081);
          Reason::Reason((Reason *)in_stack_fffffffffffffea8,
                         (Lit)(int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
          r.field_0._a._4_4_ = uVar3;
          r.field_0._a._0_4_ = in_stack_fffffffffffffed8;
          enqueue(in_stack_fffffffffffffed0,(Lit)(int)((ulong)paVar6 >> 0x20),r);
        }
      }
      else if (uVar3 == 2) {
        *local_48 = *local_40;
        local_48 = local_48 + 1;
        local_40 = local_40 + 1;
        uVar3 = WatchElem::d2((WatchElem *)local_58);
        ppPVar7 = vec<Propagator_*>::operator[](&engine.propagators,uVar3);
        in_stack_fffffffffffffed0 = (SAT *)*ppPVar7;
        uVar3 = WatchElem::d1((WatchElem *)local_58);
        (*(in_stack_fffffffffffffed0->super_Branching)._vptr_Branching[2])
                  (in_stack_fffffffffffffed0,(ulong)uVar3,0);
      }
      else {
        local_90 = WatchElem::pt((WatchElem *)local_58);
        local_40 = local_40 + 1;
        pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        local_98 = pLVar5->x;
        local_91 = value(in_stack_fffffffffffffea8,(Lit)(int)in_stack_fffffffffffffeb0);
        local_99 = ::l_True.value;
        bVar1 = lbool::operator==(&local_91,::l_True);
        local_131 = true;
        if (!bVar1) {
          pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
          ;
          local_a0 = pLVar5->x;
          local_9a = value(in_stack_fffffffffffffea8,(Lit)(int)in_stack_fffffffffffffeb0);
          local_a1 = ::l_True.value;
          local_131 = lbool::operator==(&local_9a,::l_True);
        }
        if (local_131 == false) {
          local_b8 = local_24;
          local_b4 = operator~((Lit)0x293328);
          pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
          ;
          local_bc = local_b4.x;
          bVar1 = Lit::operator==(pLVar5,local_b4);
          if (bVar1) {
            pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                        in_stack_fffffffffffffe9c);
            pLVar8 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                        in_stack_fffffffffffffe9c);
            pLVar8->x = pLVar5->x;
            pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                        in_stack_fffffffffffffe9c);
            pLVar5->x = local_b4.x;
          }
          for (local_c0 = 2; uVar2 = local_c0, uVar4 = Clause::size(local_90), uVar2 < uVar4;
              local_c0 = local_c0 + 1) {
            pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                        in_stack_fffffffffffffe9c);
            local_c8 = pLVar5->x;
            local_c1 = value(in_stack_fffffffffffffea8,(Lit)(int)in_stack_fffffffffffffeb0);
            local_c9 = ::l_False.value;
            bVar1 = lbool::operator!=(&local_c1,::l_False);
            if (bVar1) {
              in_stack_fffffffffffffea0 =
                   (vec<WatchElem> *)
                   Clause::operator[]((Clause *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
              ;
              pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                          in_stack_fffffffffffffe9c);
              pLVar5->x = in_stack_fffffffffffffea0->sz;
              pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                          in_stack_fffffffffffffe9c);
              pLVar5->x = local_b4.x;
              in_stack_fffffffffffffea8 = (SAT *)(in_RDI + 0x40);
              pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                          in_stack_fffffffffffffe9c);
              local_d4 = pLVar5->x;
              local_d0 = (int)operator~((Lit)0x2934c5);
              uVar3 = toInt((Lit)local_d0);
              in_stack_fffffffffffffeb0 =
                   vec<vec<WatchElem>_>::operator[]
                             ((vec<vec<WatchElem>_> *)in_stack_fffffffffffffea8,uVar3);
              WatchElem::WatchElem(&local_e0,local_90);
              vec<WatchElem>::push(in_stack_fffffffffffffeb0,(WatchElem *)in_stack_fffffffffffffea8)
              ;
              goto LAB_00292f6a;
            }
          }
          WatchElem::WatchElem((WatchElem *)&local_e8,local_90);
          *local_48 = local_e8;
          local_48 = local_48 + 1;
          pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c)
          ;
          local_f0 = pLVar5->x;
          local_e9 = value(in_stack_fffffffffffffea8,(Lit)(int)in_stack_fffffffffffffeb0);
          local_f1 = ::l_False.value;
          bVar1 = lbool::operator==(&local_e9,::l_False);
          if (bVar1) {
            *(Clause **)(in_RDI + 0xf0) = local_90;
            uVar3 = vec<Lit>::size(local_20);
            *local_18 = uVar3;
            while (local_40 < local_50) {
              *local_48 = *local_40;
              local_48 = local_48 + 1;
              local_40 = local_40 + 1;
            }
          }
          else {
            pLVar5 = Clause::operator[]((Clause *)in_stack_fffffffffffffea0,
                                        in_stack_fffffffffffffe9c);
            local_f8 = pLVar5->x;
            Reason::Reason(&local_100,local_90);
            r_00.field_0._a._4_4_ = uVar3;
            r_00.field_0._a._0_4_ = in_stack_fffffffffffffed8;
            enqueue(in_stack_fffffffffffffed0,(Lit)(int)((ulong)paVar6 >> 0x20),r_00);
          }
        }
        else {
          WatchElem::WatchElem((WatchElem *)&local_b0,local_90);
          *local_48 = local_b0;
          local_48 = local_48 + 1;
        }
      }
      goto LAB_00292f6a;
    }
    vec<WatchElem>::shrink(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
  } while( true );
}

Assistant:

bool SAT::propagate() {
	int num_props = 0;

	int& qhead = this->qhead.last();
	vec<Lit>& trail = this->trail.last();

	while (qhead < static_cast<int>(trail.size())) {
		num_props++;

		const Lit p = trail[qhead++];  // 'p' is enqueued fact to propagate.
		vec<WatchElem>& ws = watches[toInt(p)];

		if (ws.size() == 0) {
			continue;
		}

		WatchElem* i;
		WatchElem* j;
		WatchElem* end;

		for (i = j = ws, end = i + ws.size(); i != end;) {
			const WatchElem& we = *i;
			switch (we.type()) {
				case 1: {
					// absorbed binary clause
					*j++ = *i++;
					const Lit q = toLit(we.d2());
					switch (toInt(value(q))) {
						case 0:
							enqueue(q, ~p);
							break;
						case -1:
							setConfl(q, ~p);
							qhead = trail.size();
							while (i < end) {
								*j++ = *i++;
							}
							break;
						default:;
					}
					continue;
				}
				case 2: {
					// wake up FD propagator
					*j++ = *i++;
					engine.propagators[we.d2()]->wakeup(we.d1(), 0);
					continue;
				}
				default:
					Clause& c = *we.pt();
					i++;

					// Check if already satisfied
					if (value(c[0]) == l_True || value(c[1]) == l_True) {
						*j++ = &c;
						continue;
					}

					const Lit false_lit = ~p;

					// Make sure the false literal is data[1]:
					if (c[0] == false_lit) {
						c[0] = c[1], c[1] = false_lit;
					}

					// Look for new watch:
					for (unsigned int k = 2; k < c.size(); k++) {
						if (value(c[k]) != l_False) {
							c[1] = c[k];
							c[k] = false_lit;
							watches[toInt(~c[1])].push(&c);
							goto FoundWatch;
						}
					}

					// Did not find watch -- clause is unit under assignment:
					*j++ = &c;
					if (value(c[0]) == l_False) {
						confl = &c;
						qhead = trail.size();
						while (i < end) {
							*j++ = *i++;
						}
					} else {
						enqueue(c[0], &c);
					}
				FoundWatch:;
			}
		}
		ws.shrink(static_cast<int>(i - j));
	}
	propagations += num_props;

	return (confl == nullptr);
}